

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iarchive_suite.cpp
# Opt level: O1

void dynamic_suite::run(void)

{
  test_null();
  test_boolean();
  test_integer_small();
  test_integer();
  test_number();
  test_string();
  test_array_empty();
  test_array();
  deprecated_test_map_empty();
  test_map_empty();
  deprecated_test_map();
  test_map();
  return;
}

Assistant:

void run()
{
    test_null();
    test_boolean();
    test_integer_small();
    test_integer();
    test_number();
    test_string();
    test_array_empty();
    test_array();
    deprecated_test_map_empty();
    test_map_empty();
    deprecated_test_map();
    test_map();
}